

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

_Bool scan_heredoc_end_identifier(Heredoc *heredoc,TSLexer *lexer)

{
  int32_t iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  size_t __size;
  uint uVar6;
  _Bool _Var7;
  
  uVar5 = (ulong)(heredoc->current_leading_word).size;
  if (uVar5 != 0) {
    memset((heredoc->current_leading_word).contents,0,uVar5);
    (heredoc->current_leading_word).size = 0;
  }
  if ((heredoc->delimiter).size != 0) {
    uVar5 = 0;
    while ((iVar3 = lexer->lookahead, iVar3 != 0 && (iVar3 != 10))) {
      uVar6 = (heredoc->delimiter).size;
      if (uVar6 <= uVar5) {
        __assert_fail("(uint32_t)(size) < (&heredoc->delimiter)->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-bash/src/scanner.c"
                      ,0xe9,"_Bool scan_heredoc_end_identifier(Heredoc *, TSLexer *)");
      }
      if ((iVar3 != (heredoc->delimiter).contents[uVar5]) ||
         (uVar6 <= (heredoc->current_leading_word).size)) break;
      uVar6 = (heredoc->current_leading_word).capacity;
      uVar2 = (heredoc->current_leading_word).size + 1;
      if (uVar6 < uVar2) {
        uVar6 = uVar6 * 2;
        if (uVar6 <= uVar2) {
          uVar6 = uVar2;
        }
        if (uVar6 < 9) {
          uVar6 = 8;
        }
        pcVar4 = (heredoc->current_leading_word).contents;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = (char *)malloc((ulong)uVar6);
        }
        else {
          pcVar4 = (char *)realloc(pcVar4,(ulong)uVar6);
        }
        (heredoc->current_leading_word).contents = pcVar4;
        (heredoc->current_leading_word).capacity = uVar6;
      }
      iVar1 = lexer->lookahead;
      uVar6 = (heredoc->current_leading_word).size;
      (heredoc->current_leading_word).size = uVar6 + 1;
      (heredoc->current_leading_word).contents[uVar6] = (char)iVar1;
      (*lexer->advance)(lexer,false);
      uVar5 = uVar5 + 1;
    }
  }
  uVar6 = (heredoc->current_leading_word).capacity;
  uVar2 = (heredoc->current_leading_word).size + 1;
  if (uVar6 < uVar2) {
    uVar6 = uVar6 * 2;
    if (uVar6 <= uVar2) {
      uVar6 = uVar2;
    }
    __size = 8;
    if (8 < uVar6) {
      __size = (size_t)uVar6;
    }
    pcVar4 = (heredoc->current_leading_word).contents;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)malloc(__size);
    }
    else {
      pcVar4 = (char *)realloc(pcVar4,__size);
    }
    (heredoc->current_leading_word).contents = pcVar4;
    (heredoc->current_leading_word).capacity = (uint32_t)__size;
  }
  uVar6 = (heredoc->current_leading_word).size;
  (heredoc->current_leading_word).size = uVar6 + 1;
  (heredoc->current_leading_word).contents[uVar6] = '\0';
  if ((heredoc->delimiter).size == 0) {
    _Var7 = false;
  }
  else {
    iVar3 = strcmp((heredoc->current_leading_word).contents,(heredoc->delimiter).contents);
    _Var7 = iVar3 == 0;
  }
  return _Var7;
}

Assistant:

static bool scan_heredoc_end_identifier(Heredoc *heredoc, TSLexer *lexer) {
    reset_string(&heredoc->current_leading_word);
    // Scan the first 'n' characters on this line, to see if they match the
    // heredoc delimiter
    int32_t size = 0;
    if (heredoc->delimiter.size > 0) {
        while (lexer->lookahead != '\0' && lexer->lookahead != '\n' &&
               (int32_t)*array_get(&heredoc->delimiter, size) == lexer->lookahead &&
               heredoc->current_leading_word.size < heredoc->delimiter.size) {
            array_push(&heredoc->current_leading_word, lexer->lookahead);
            advance(lexer);
            size++;
        }
    }
    array_push(&heredoc->current_leading_word, '\0');
    return heredoc->delimiter.size == 0
               ? false
               : strcmp(heredoc->current_leading_word.contents, heredoc->delimiter.contents) == 0;
}